

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

_Bool ox_buffer_write(buffer_s *self,char *data,size_t len)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  size_t __n;
  bool bVar5;
  bool bVar6;
  
  uVar1 = self->data_len;
  sVar4 = self->write_pos;
  bVar5 = uVar1 - sVar4 < len;
  if (bVar5) {
    sVar3 = self->read_pos;
    bVar6 = uVar1 - (sVar4 - sVar3) < len;
    bVar2 = !bVar6;
    __n = sVar4 - sVar3;
    if (bVar6) {
      sVar3 = 0;
    }
    else {
      do {
        if (sVar3 != 0) {
          if (sVar4 != sVar3) {
            memmove(self->data,self->data + sVar3,__n);
            uVar1 = self->data_len;
          }
          self->read_pos = 0;
          self->write_pos = __n;
          sVar4 = __n;
        }
        if (len <= uVar1 - sVar4) goto LAB_0013728a;
        sVar3 = 0;
        __n = sVar4;
      } while (len <= uVar1 - sVar4);
    }
  }
  else {
LAB_0013728a:
    if (sVar4 < uVar1) {
      __dest = self->data + sVar4;
    }
    else {
      __dest = (char *)0x0;
    }
    memcpy(__dest,data,len);
    uVar1 = len + self->write_pos;
    sVar3 = 1;
    bVar2 = bVar5;
    if (uVar1 <= self->data_len) {
      self->write_pos = uVar1;
    }
  }
  return (_Bool)(bVar2 | (byte)sVar3);
}

Assistant:

bool 
ox_buffer_write(struct buffer_s* self, const char* data, size_t len)
{
    bool write_ret = true;

    if(ox_buffer_getwritevalidcount(self) >= len)
    {
        /*  直接写入    */
        memcpy(ox_buffer_getwriteptr(self), data, len);
        ox_buffer_addwritepos(self, len);
    }
    else
    {
        size_t left_len = self->data_len - ox_buffer_getreadvalidcount(self);
        if(left_len >= len)
        {
            ox_buffer_adjustto_head(self);
            ox_buffer_write(self, data, len);
        }
        else
        {
            write_ret = false;
        }
    }

    return write_ret;
}